

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_async_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  JSValue this_obj_00;
  int iVar1;
  undefined4 *puVar2;
  undefined4 in_R9D;
  JSValue v;
  JSValueUnion unaff_retaddr;
  JSContext *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  int in_stack_00000030;
  JSValue *in_stack_00000038;
  JSAsyncFunctionData *s;
  JSValue promise;
  JSAsyncFunctionData *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  JSContext *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  JSValue JVar3;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint uStack_64;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff4;
  JSContext *in_stack_fffffffffffffff8;
  int64_t iVar5;
  
  puVar2 = (undefined4 *)
           js_mallocz((JSContext *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff78._8_8_);
  if (puVar2 == (undefined4 *)0x0) {
    uVar4 = 0;
    iVar5 = 6;
  }
  else {
    *puVar2 = 1;
    add_gc_object((JSRuntime *)in_stack_ffffffffffffff70,
                  (JSGCObjectHeader *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                  JS_GC_OBJ_TYPE_JS_OBJECT);
    puVar2[0xe] = 0;
    *(ulong *)(puVar2 + 6) = (ulong)uStack_64 << 0x20;
    *(undefined8 *)(puVar2 + 8) = 3;
    *(ulong *)(puVar2 + 10) = (ulong)in_stack_ffffffffffffff8c << 0x20;
    *(undefined8 *)(puVar2 + 0xc) = 3;
    v = JS_NewPromiseCapability(in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_);
    iVar5 = v.tag;
    JVar3 = v;
    iVar1 = JS_IsException(v);
    if ((iVar1 == 0) &&
       (this_obj_00.tag = (int64_t)in_stack_00000008, this_obj_00.u.float64 = unaff_retaddr.float64,
       iVar1 = async_func_init(in_stack_fffffffffffffff8,
                               (JSAsyncFunctionState *)
                               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                               (JSValue)in_stack_00000010,this_obj_00,in_stack_00000030,
                               in_stack_00000038), in_stack_ffffffffffffff68 = in_R9D,
       in_stack_ffffffffffffff70 = in_stack_00000008, iVar1 == 0)) {
      puVar2[0xe] = 1;
      js_async_function_resume((JSContext *)argv,in_stack_00000098);
      js_async_function_free
                ((JSRuntime *)in_stack_00000008,
                 (JSAsyncFunctionData *)CONCAT44(in_stack_ffffffffffffff6c,in_R9D));
      uVar4 = v.u._0_4_;
      in_stack_fffffffffffffff4 = v.u._4_4_;
    }
    else {
      JS_FreeValue(in_stack_ffffffffffffff70,JVar3);
      js_async_function_free
                ((JSRuntime *)in_stack_ffffffffffffff70,
                 (JSAsyncFunctionData *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      uVar4 = 0;
      iVar5 = 6;
    }
  }
  JVar3.u._4_4_ = in_stack_fffffffffffffff4;
  JVar3.u.int32 = uVar4;
  JVar3.tag = iVar5;
  return JVar3;
}

Assistant:

static JSValue js_async_function_call(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSValue promise;
    JSAsyncFunctionData *s;

    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        return JS_EXCEPTION;
    s->header.ref_count = 1;
    add_gc_object(ctx->rt, &s->header, JS_GC_OBJ_TYPE_ASYNC_FUNCTION);
    s->is_active = FALSE;
    s->resolving_funcs[0] = JS_UNDEFINED;
    s->resolving_funcs[1] = JS_UNDEFINED;

    promise = JS_NewPromiseCapability(ctx, s->resolving_funcs);
    if (JS_IsException(promise))
        goto fail;

    if (async_func_init(ctx, &s->func_state, func_obj, this_obj, argc, argv)) {
    fail:
        JS_FreeValue(ctx, promise);
        js_async_function_free(ctx->rt, s);
        return JS_EXCEPTION;
    }
    s->is_active = TRUE;

    js_async_function_resume(ctx, s);

    js_async_function_free(ctx->rt, s);

    return promise;
}